

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O3

void __thiscall hgdb::json::SymbolTable::VariableCount::handle(VariableCount *this,Module *m)

{
  pointer pvVar1;
  variant_alternative_t<0UL,_variant<Variable,_unsigned_long>_> *__k;
  mapped_type *pmVar2;
  variant<hgdb::json::Variable,_unsigned_long> *v;
  pointer __v;
  
  __v = (m->variables_).
        super__Vector_base<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (m->variables_).
           super__Vector_base<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__v != pvVar1) {
    do {
      if ((__v->super__Variant_base<hgdb::json::Variable,_unsigned_long>).
          super__Move_assign_alias<hgdb::json::Variable,_unsigned_long>.
          super__Copy_assign_alias<hgdb::json::Variable,_unsigned_long>.
          super__Move_ctor_alias<hgdb::json::Variable,_unsigned_long>.
          super__Copy_ctor_alias<hgdb::json::Variable,_unsigned_long>.
          super__Variant_storage_alias<hgdb::json::Variable,_unsigned_long>._M_index == '\0') {
        __k = std::get<0ul,hgdb::json::Variable,unsigned_long>(__v);
        pmVar2 = std::__detail::
                 _Map_base<hgdb::json::Variable,_std::pair<const_hgdb::json::Variable,_unsigned_long>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<hgdb::json::Variable>,_hgdb::json::Variable::hash_fn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<hgdb::json::Variable,_std::pair<const_hgdb::json::Variable,_unsigned_long>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<hgdb::json::Variable>,_hgdb::json::Variable::hash_fn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->count,__k);
        *pmVar2 = *pmVar2 + 1;
      }
      __v = __v + 1;
    } while (__v != pvVar1);
  }
  return;
}

Assistant:

void handle(Module *m) override {
            for (auto const &v : m->variables_) {
                if (v.index() == 0) {
                    count[std::get<0>(v)]++;
                }
            }
        }